

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O2

ir_rvalue * __thiscall
ast_compound_statement::hir
          (ast_compound_statement *this,exec_list *instructions,_mesa_glsl_parse_state *state)

{
  exec_node **ppeVar1;
  exec_node *peVar2;
  
  if (this->new_scope != 0) {
    glsl_symbol_table::push_scope(state->symbols);
  }
  peVar2 = &(this->statements).head_sentinel;
  while ((peVar2 = ((exec_node *)&peVar2->next)->next, peVar2->next != (exec_node *)0x0 &&
         (ppeVar1 = &peVar2[-3].prev, ppeVar1 != (exec_node **)0x0))) {
    (*(code *)(*ppeVar1)->prev)(ppeVar1,instructions,state);
  }
  if (this->new_scope != 0) {
    glsl_symbol_table::pop_scope(state->symbols);
  }
  return (ir_rvalue *)0x0;
}

Assistant:

ir_rvalue *
ast_compound_statement::hir(exec_list *instructions,
                            struct _mesa_glsl_parse_state *state)
{
   if (new_scope)
      state->symbols->push_scope();

   foreach_list_typed (ast_node, ast, link, &this->statements)
      ast->hir(instructions, state);

   if (new_scope)
      state->symbols->pop_scope();

   /* Compound statements do not have r-values.
    */
   return NULL;
}